

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.t.cpp
# Opt level: O1

void __thiscall dynamicgraph::Signal<int,_int>::trace(Signal<int,_int> *this,ostream *os)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*(this->super_SignalBase<int>)._vptr_SignalBase[0x1d])();
  std::ostream::operator<<(os,*(int *)CONCAT44(extraout_var,iVar1));
  return;
}

Assistant:

void Signal<T, Time>::trace(std::ostream &os) const {
  try {
    signal_io<T>::trace(this->accessCopy(), os);
  } catch DG_RETHROW catch (...) {
    DG_THROW ExceptionSignal(ExceptionSignal::SET_IMPOSSIBLE,
                             "TRACE operation not possible with this signal. ",
                             "(bad cast while getting value from %s).",
                             SignalBase<Time>::getName().c_str());
  }
}